

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

UdpFieldBaseSyntax * __thiscall
slang::parsing::Parser::parseUdpField
          (Parser *this,bool required,bool isInput,bool isSequential,bool *sawTransition)

{
  Token field;
  Token openParen_00;
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  Token second_00;
  Token closeParen_00;
  optional<slang::SourceLocation> loc;
  Token TVar1;
  Token TVar2;
  Token TVar3;
  Info *this_00;
  bool bVar4;
  char cVar5;
  SourceLocation SVar6;
  size_type sVar7;
  SourceLocation SVar8;
  byte in_CL;
  byte in_DL;
  byte in_SIL;
  Info *in_RDI;
  Token first_00;
  char c_1;
  string_view text_1;
  Token next;
  bool error;
  char c;
  size_t i;
  string_view text;
  Token tok;
  const_iterator __end7;
  const_iterator __begin7;
  initializer_list<slang::parsing::Token> *__range7;
  int idx;
  char chars [2];
  UdpEdgeFieldSyntax *result;
  Token closeParen;
  Token second;
  Token first;
  bool error_1;
  Token openParen;
  anon_class_24_3_e8089fb6 nextSymbol;
  anon_class_32_4_e325f0aa checkTransition;
  undefined8 in_stack_fffffffffffffd68;
  Info *in_stack_fffffffffffffd70;
  initializer_list<slang::parsing::Token> *this_01;
  undefined6 uVar9;
  TokenKind in_stack_fffffffffffffd7e;
  undefined2 uVar10;
  ParserBase *in_stack_fffffffffffffd80;
  Token *this_02;
  ParserBase *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  SourceLocation in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 uVar11;
  DiagCode in_stack_fffffffffffffda4;
  DiagCode code;
  undefined8 in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  char in_stack_fffffffffffffdbf;
  Diagnostic *in_stack_fffffffffffffdc0;
  undefined2 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdca;
  undefined1 in_stack_fffffffffffffdce;
  undefined1 in_stack_fffffffffffffdcf;
  ParserBase *in_stack_fffffffffffffdd0;
  SourceLocation in_stack_fffffffffffffdd8;
  DiagCode in_stack_fffffffffffffde4;
  string_view local_218;
  Token in_stack_fffffffffffffdf8;
  unkbyte10 Var12;
  bool *in_stack_fffffffffffffe40;
  basic_string_view<char,_std::char_traits<char>_> in_stack_fffffffffffffe48;
  unkbyte10 Var13;
  Token local_1a8;
  const_iterator local_198;
  const_iterator local_190;
  Token local_188;
  undefined8 local_178;
  Info *local_170;
  initializer_list<slang::parsing::Token> local_168;
  initializer_list<slang::parsing::Token> *local_158;
  int local_150;
  char local_14a [2];
  SourceRange local_148;
  undefined4 local_134;
  string_view local_130;
  string_view local_120;
  SourceRange local_110;
  undefined4 local_fc;
  Token local_f8;
  undefined8 local_e8;
  initializer_list<slang::parsing::Token> *local_e0;
  undefined8 local_d8;
  Info *local_d0;
  undefined8 local_c8;
  Info *local_c0;
  UdpEdgeFieldSyntax *local_b8;
  Token local_b0;
  Token local_a0;
  Token local_90;
  byte local_79;
  Token local_78;
  byte **local_50;
  byte *local_48;
  byte *local_40 [3];
  byte *local_28;
  byte local_13;
  byte local_12;
  byte local_11;
  UdpEdgeFieldSyntax *local_8;
  
  Var13 = in_stack_fffffffffffffe48._6_10_;
  Var12 = in_stack_fffffffffffffdf8._6_10_;
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  local_13 = in_CL & 1;
  local_40[0] = &local_12;
  local_28 = &local_13;
  local_50 = local_40;
  local_48 = &local_12;
  bVar4 = ParserBase::peek(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7e);
  if (bVar4) {
    std::optional<slang::SourceLocation>::optional((optional<slang::SourceLocation> *)0x8c4aa8);
    loc.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceLocation>._M_payload._2_4_ = in_stack_fffffffffffffdca
    ;
    loc.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceLocation>._M_payload._0_2_ = in_stack_fffffffffffffdc8
    ;
    loc.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceLocation>._M_payload._6_1_ = in_stack_fffffffffffffdce
    ;
    loc.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceLocation>._M_payload._7_1_ = in_stack_fffffffffffffdcf
    ;
    loc.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceLocation>._8_8_ = in_stack_fffffffffffffdd0;
    parseUdpField::anon_class_32_4_e325f0aa::operator()
              ((anon_class_32_4_e325f0aa *)in_stack_fffffffffffffdc0,loc);
    local_78 = ParserBase::consume((ParserBase *)
                                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    local_79 = 0;
    local_90 = parseUdpField::anon_class_24_3_e8089fb6::operator()
                         (SUB108(Var13,2),SUB101(Var13,1),SUB101(Var13,0),in_stack_fffffffffffffe40)
    ;
    local_a0 = parseUdpField::anon_class_24_3_e8089fb6::operator()
                         (SUB108(Var13,2),SUB101(Var13,1),SUB101(Var13,0),in_stack_fffffffffffffe40)
    ;
    first_00 = ParserBase::expect(SUB108(Var12,2),(TokenKind)Var12);
    TVar3 = local_78;
    TVar2 = local_90;
    TVar1 = local_a0;
    local_c8._0_2_ = local_78.kind;
    local_c8._2_1_ = local_78._2_1_;
    local_c8._3_1_ = local_78.numFlags.raw;
    local_c8._4_4_ = local_78.rawLen;
    local_78.info = TVar3.info;
    local_c0 = local_78.info;
    local_d8._0_2_ = local_90.kind;
    local_d8._2_1_ = local_90._2_1_;
    local_d8._3_1_ = local_90.numFlags.raw;
    local_d8._4_4_ = local_90.rawLen;
    local_90.info = TVar2.info;
    local_d0 = local_90.info;
    local_e8._0_2_ = local_a0.kind;
    local_e8._2_1_ = local_a0._2_1_;
    local_e8._3_1_ = local_a0.numFlags.raw;
    local_e8._4_4_ = local_a0.rawLen;
    local_a0.info = TVar1.info;
    local_e0 = (initializer_list<slang::parsing::Token> *)local_a0.info;
    local_b0._0_8_ = first_00._0_8_;
    local_f8.kind = local_b0.kind;
    local_f8._2_1_ = local_b0._2_1_;
    local_f8.numFlags.raw = local_b0.numFlags.raw;
    local_f8.rawLen = local_b0.rawLen;
    local_b0.info = first_00.info;
    local_f8.info = local_b0.info;
    uVar9 = first_00._0_6_;
    uVar10 = first_00.rawLen._2_2_;
    openParen_00.info._0_4_ = in_stack_fffffffffffffd90;
    openParen_00._0_8_ = in_stack_fffffffffffffd88;
    openParen_00.info._4_4_ = in_stack_fffffffffffffd94;
    second_00.rawLen._0_2_ = in_stack_fffffffffffffda4.subsystem;
    second_00.rawLen._2_2_ = in_stack_fffffffffffffda4.code;
    second_00.kind = (short)in_stack_fffffffffffffda0;
    second_00._2_1_ = (char)((uint)in_stack_fffffffffffffda0 >> 0x10);
    second_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffda0 >> 0x18);
    second_00.info = in_RDI;
    closeParen_00.info._0_7_ = in_stack_fffffffffffffdb8;
    closeParen_00.kind = (short)in_stack_fffffffffffffdb0;
    closeParen_00._2_1_ = (char)((ulong)in_stack_fffffffffffffdb0 >> 0x10);
    closeParen_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffdb0 >> 0x18);
    closeParen_00.rawLen = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
    closeParen_00.info._7_1_ = in_stack_fffffffffffffdbf;
    this_01 = (initializer_list<slang::parsing::Token> *)local_a0.info;
    this_02 = (Token *)local_b0.info;
    local_b0 = first_00;
    this_00 = local_a0.info;
    local_a0 = TVar1;
    local_90 = TVar2;
    local_78 = TVar3;
    local_b8 = slang::syntax::SyntaxFactory::udpEdgeField
                         ((SyntaxFactory *)this_00,openParen_00,first_00,second_00,closeParen_00);
    bVar4 = Token::isMissing(&local_b0);
    if (!bVar4) {
      if ((local_12 & 1) == 0) {
        local_fc = 0xb30005;
        local_110 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffdc0);
        range.startLoc._4_4_ = in_stack_fffffffffffffd94;
        range.startLoc._0_4_ = in_stack_fffffffffffffd90;
        range.endLoc = in_stack_fffffffffffffd98;
        ParserBase::addDiag(in_stack_fffffffffffffd88,in_stack_fffffffffffffda4,range);
      }
      else if ((local_79 & 1) == 0) {
        local_120 = Token::rawText(this_02);
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_120);
        uVar11 = (undefined4)sVar7;
        code = SUB84(sVar7 >> 0x20,0);
        local_130 = Token::rawText(this_02);
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_130);
        if (CONCAT44(code,uVar11) + sVar7 == 2) {
          memset(local_14a,0,2);
          TVar2 = local_90;
          TVar1 = local_a0;
          local_150 = 0;
          local_188.kind = local_90.kind;
          local_188._2_1_ = local_90._2_1_;
          local_188.numFlags.raw = local_90.numFlags.raw;
          local_188.rawLen = local_90.rawLen;
          local_90.info = TVar2.info;
          local_188.info = local_90.info;
          local_178._0_2_ = local_a0.kind;
          local_178._2_1_ = local_a0._2_1_;
          local_178._3_1_ = local_a0.numFlags.raw;
          local_178._4_4_ = local_a0.rawLen;
          local_a0.info = TVar1.info;
          local_170 = local_a0.info;
          local_168._M_array = &local_188;
          local_168._M_len = 2;
          local_158 = &local_168;
          local_a0 = TVar1;
          local_90 = TVar2;
          local_190 = std::initializer_list<slang::parsing::Token>::begin(local_158);
          local_198 = std::initializer_list<slang::parsing::Token>::end(this_01);
          for (; local_190 != local_198; local_190 = local_190 + 1) {
            local_1a8.kind = local_190->kind;
            local_1a8._2_1_ = local_190->field_0x2;
            local_1a8.numFlags.raw = (local_190->numFlags).raw;
            local_1a8.rawLen = local_190->rawLen;
            local_1a8.info = local_190->info;
            Token::rawText(this_02);
            in_stack_fffffffffffffd98 = (SourceLocation)0x0;
            while (SVar8 = in_stack_fffffffffffffd98,
                  SVar6 = (SourceLocation)
                          std::basic_string_view<char,_std::char_traits<char>_>::length
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     &stack0xfffffffffffffe48),
                  (ulong)in_stack_fffffffffffffd98 < (ulong)SVar6) {
              std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xfffffffffffffe48,(size_type)SVar8);
              cVar5 = charToLower('\0');
              in_stack_fffffffffffffd94 = (int)cVar5;
              if ((((in_stack_fffffffffffffd94 - 0x30U < 2) || (in_stack_fffffffffffffd94 == 0x3f))
                  || (in_stack_fffffffffffffd94 == 0x62)) || (in_stack_fffffffffffffd94 == 0x78)) {
                local_14a[local_150] = cVar5;
                local_150 = local_150 + 1;
              }
              else {
                Token::location(&local_1a8);
                SourceLocation::operator+<unsigned_long>
                          ((SourceLocation *)CONCAT26(uVar10,uVar9),(unsigned_long)this_01);
                ParserBase::addDiag(in_stack_fffffffffffffdd0,in_stack_fffffffffffffde4,
                                    in_stack_fffffffffffffdd8);
                Diagnostic::operator<<(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbf);
              }
              in_stack_fffffffffffffd98 = (SourceLocation)((long)SVar8 + 1);
            }
          }
          if (((local_150 == 2) && (local_14a[0] == local_14a[1])) &&
             ((local_14a[0] != 'b' && (local_14a[0] != '?')))) {
            slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffdc0);
            range_01.startLoc._4_4_ = in_stack_fffffffffffffd94;
            range_01.startLoc._0_4_ = in_stack_fffffffffffffd90;
            range_01.endLoc = in_stack_fffffffffffffd98;
            ParserBase::addDiag(in_stack_fffffffffffffd88,code,range_01);
          }
        }
        else {
          local_134 = 0xb70005;
          local_148 = slang::syntax::SyntaxNode::sourceRange
                                ((SyntaxNode *)in_stack_fffffffffffffdc0);
          range_00.startLoc._4_4_ = in_stack_fffffffffffffd94;
          range_00.startLoc._0_4_ = in_stack_fffffffffffffd90;
          range_00.endLoc = in_stack_fffffffffffffd98;
          ParserBase::addDiag(in_stack_fffffffffffffd88,code,range_00);
        }
      }
    }
    local_8 = local_b8;
  }
  else {
    parseUdpField::anon_class_24_3_e8089fb6::operator()
              (SUB108(Var13,2),SUB101(Var13,1),SUB101(Var13,0),in_stack_fffffffffffffe40);
    bVar4 = Token::operator_cast_to_bool((Token *)0x8c50c3);
    if (bVar4) {
      if ((local_12 & 1) == 0) {
        local_218 = Token::rawText((Token *)in_stack_fffffffffffffd80);
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_218);
        if (sVar7 < 2) {
          bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_218);
          if (!bVar4) {
            std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_218,0);
            cVar5 = charToLower('\0');
            if (((cVar5 == '*') || (cVar5 == 'f')) ||
               ((cVar5 == 'n' || ((cVar5 == 'p' || (cVar5 == 'r')))))) {
              SVar8 = Token::location((Token *)&stack0xfffffffffffffdf8);
              ParserBase::addDiag(in_stack_fffffffffffffdd0,in_stack_fffffffffffffde4,
                                  in_stack_fffffffffffffdd8);
              Diagnostic::operator<<((Diagnostic *)SVar8,in_stack_fffffffffffffdbf);
            }
          }
        }
        else {
          Token::range((Token *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
          range_02.startLoc._4_4_ = in_stack_fffffffffffffd94;
          range_02.startLoc._0_4_ = in_stack_fffffffffffffd90;
          range_02.endLoc = in_stack_fffffffffffffd98;
          ParserBase::addDiag(in_stack_fffffffffffffd88,in_stack_fffffffffffffda4,range_02);
        }
      }
      field.info = in_stack_fffffffffffffd70;
      field.kind = (short)in_stack_fffffffffffffd68;
      field._2_1_ = (char)((ulong)in_stack_fffffffffffffd68 >> 0x10);
      field.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd68 >> 0x18);
      field.rawLen = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
      local_8 = (UdpEdgeFieldSyntax *)
                slang::syntax::SyntaxFactory::udpSimpleField((SyntaxFactory *)0x8c524b,field);
    }
    else {
      local_8 = (UdpEdgeFieldSyntax *)0x0;
    }
  }
  return &local_8->super_UdpFieldBaseSyntax;
}

Assistant:

UdpFieldBaseSyntax* Parser::parseUdpField(bool required, bool isInput, bool isSequential,
                                          bool& sawTransition) {
    auto checkTransition = [&](std::optional<SourceLocation> loc = {}) {
        if (isInput) {
            if (sawTransition) {
                if (!loc)
                    loc = peek().location();
                addDiag(diag::UdpDupTransition, *loc);
            }
            else if (!isSequential) {
                if (!loc)
                    loc = peek().location();
                addDiag(diag::UdpEdgeInComb, *loc);
            }
        }
        sawTransition = true;
    };

    auto nextSymbol = [&](bool required, bool insideTrans, bool& error) {
        switch (peek().kind) {
            case TokenKind::Question:
                return consume();
            case TokenKind::Star:
                if (!insideTrans)
                    checkTransition();
                return consume();
            case TokenKind::Minus: {
                auto tok = consume();
                if (isInput) {
                    error = true;
                    addDiag(diag::UdpInvalidMinus, tok.location());
                }
                return tok;
            }
            case TokenKind::Identifier:
            case TokenKind::IntegerLiteral: {
                auto tok = consume();
                auto text = tok.rawText();
                for (size_t i = 0; i < text.length(); i++) {
                    char c = charToLower(text[i]);
                    switch (c) {
                        case '0':
                        case '1':
                        case 'x':
                        case 'b':
                            break;
                        case 'r':
                        case 'f':
                        case 'p':
                        case 'n':
                            if (!insideTrans)
                                checkTransition(tok.location() + i);
                            break;
                        default:
                            error = true;
                            addDiag(diag::UdpInvalidSymbol, tok.location() + i) << c;
                            break;
                    }
                }
                return tok;
            }
            default:
                if (required) {
                    error = true;
                    addDiag(diag::ExpectedUdpSymbol, peek().location());
                }
                return Token();
        }
    };

    if (peek(TokenKind::OpenParenthesis)) {
        checkTransition();
        auto openParen = consume();

        bool error = false;
        auto first = nextSymbol(true, true, error);
        auto second = nextSymbol(false, true, error);
        auto closeParen = expect(TokenKind::CloseParenthesis);
        auto result = &factory.udpEdgeField(openParen, first, second, closeParen);

        if (!closeParen.isMissing()) {
            if (!isInput) {
                addDiag(diag::UdpInvalidTransition, result->sourceRange());
            }
            else if (!error) {
                if (first.rawText().size() + second.rawText().size() != 2) {
                    addDiag(diag::UdpTransitionLength, result->sourceRange());
                }
                else {
                    char chars[2] = {};
                    int idx = 0;
                    for (auto tok : {first, second}) {
                        auto text = tok.rawText();
                        for (size_t i = 0; i < text.length(); i++) {
                            char c = charToLower(text[i]);
                            switch (c) {
                                case '0':
                                case '1':
                                case 'x':
                                case 'b':
                                case '?':
                                    chars[idx++] = c;
                                    break;
                                default:
                                    addDiag(diag::UdpInvalidEdgeSymbol, tok.location() + i) << c;
                                    break;
                            }
                        }
                    }

                    if (idx == 2 && chars[0] == chars[1] && chars[0] != 'b' && chars[0] != '?')
                        addDiag(diag::UdpTransSameChar, result->sourceRange());
                }
            }
        }

        return result;
    }

    bool error = false;
    auto next = nextSymbol(required, false, error);
    if (!next)
        return nullptr;

    if (!isInput && !error) {
        auto text = next.rawText();
        if (text.length() > 1) {
            addDiag(diag::UdpSingleChar, next.range());
        }
        else if (!text.empty()) {
            char c = charToLower(text[0]);
            switch (c) {
                case '*':
                case 'r':
                case 'f':
                case 'p':
                case 'n':
                    addDiag(diag::UdpInvalidInputOnly, next.location()) << c;
                    break;
                default:
                    break;
            }
        }
    }

    return &factory.udpSimpleField(next);
}